

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void duckdb_je_free(void *ptr)

{
  bool bVar1;
  _Bool _Var2;
  ulong uVar3;
  cache_bin_t *bin_00;
  void *in_RDI;
  long *in_FS_OFFSET;
  cache_bin_t *bin;
  tcache_t *tcache;
  _Bool fail;
  uint64_t deallocated_after;
  size_t usize;
  uint64_t threshold;
  uint64_t deallocated;
  _Bool err;
  emap_alloc_ctx_t alloc_ctx;
  tsd_t *tsd;
  tcache_t *tcache_1;
  size_t ret_1;
  szind_t ret;
  uint8_t state;
  uint8_t state_3;
  tcaches_t *elm;
  uint8_t state_2;
  _Bool err_1;
  rtree_metadata_t metadata;
  rtree_ctx_t *rtree_ctx;
  uint8_t state_4;
  uint8_t state_1;
  undefined1 local_258 [8];
  undefined1 local_250 [15];
  bool local_241;
  uint local_240;
  byte local_23c;
  tsdn_t *local_238;
  undefined1 local_229;
  undefined8 local_228;
  void *local_220;
  char local_211;
  tcache_t *local_210;
  undefined1 local_206;
  undefined1 local_205;
  undefined4 local_204;
  tsdn_t *local_200;
  uint local_1f4;
  size_t local_1e8;
  uint local_1e0;
  void *in_stack_fffffffffffffe40;
  rtree_metadata_t local_ec;
  rtree_ctx_t *local_e0;
  uint *local_d8;
  emap_t *local_c8;
  tsdn_t *local_c0;
  bool local_b1;
  tsdn_t *local_b0;
  undefined1 local_91;
  void *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  tsdn_t *local_78;
  uint *local_70;
  tsdn_t *local_60;
  uint8_t local_51;
  tsdn_t *local_50;
  tsdn_t *local_48;
  tsdn_t *local_40;
  tsdn_t *local_38;
  tsdn_t *local_30;
  tsdn_t *local_28;
  
  local_228 = 0;
  local_229 = 0;
  local_238 = (tsdn_t *)(*in_FS_OFFSET + -0x2a90);
  if (local_238 == (tsdn_t *)0x0) {
    local_211 = '\0';
  }
  else {
    local_c8 = &duckdb_je_arena_emap_global;
    local_d8 = &local_240;
    local_e0 = (rtree_ctx_t *)(*in_FS_OFFSET + -0x28d8);
    local_220 = in_RDI;
    local_c0 = local_238;
    local_b0 = local_238;
    local_40 = local_238;
    _Var2 = rtree_metadata_try_read_fast
                      (local_238,&duckdb_je_arena_emap_global.rtree,local_e0,(uintptr_t)in_RDI,
                       &local_ec);
    if (!_Var2) {
      *local_d8 = local_ec.szind;
      *(byte *)(local_d8 + 1) = local_ec.slab & 1;
    }
    local_b1 = _Var2;
    local_241 = local_b1;
    bVar1 = true;
    if ((!local_b1) && (bVar1 = true, (local_23c & 1) != 0)) {
      local_90 = local_220;
      local_91 = 0;
      bVar1 = false;
    }
    if (bVar1) {
      local_211 = '\0';
    }
    else {
      local_78 = local_238;
      local_80 = local_250;
      local_88 = local_258;
      local_30 = local_238;
      local_28 = local_238;
      local_1f4 = local_240;
      local_1e0 = local_240;
      local_1e8 = duckdb_je_sz_index2size_tab[local_240];
      uVar3 = (local_238->tsd).
              cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated + local_1e8;
      if (uVar3 < (local_238->tsd).
                  cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast
         ) {
        local_70 = &local_240;
        local_210 = &(local_238->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
        local_60 = local_238;
        local_200 = local_238;
        local_204 = 0xfffffffe;
        local_205 = 0;
        local_206 = 0;
        bin_00 = (local_238->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins
                 + local_240;
        if (((uint)bin_00->stack_head & 0xffff) == (uint)bin_00->low_bits_full) {
          local_211 = '\0';
          in_stack_fffffffffffffe40 = local_220;
        }
        else {
          bin_00->stack_head = bin_00->stack_head + -1;
          *bin_00->stack_head = local_220;
          cache_bin_assert_earlier(bin_00,bin_00->low_bits_full,(uint16_t)bin_00->stack_head);
          local_50 = local_238;
          local_48 = local_238;
          local_51 = (local_238->tsd).state.repr;
          local_38 = local_238;
          (local_238->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated
               = uVar3;
          local_211 = '\x01';
          in_stack_fffffffffffffe40 = local_220;
        }
      }
      else {
        local_211 = '\0';
      }
    }
  }
  if (local_211 == '\0') {
    duckdb_je_free_default(in_stack_fffffffffffffe40);
  }
  return;
}

Assistant:

JEMALLOC_NOTHROW
je_free(void *ptr) {
	LOG("core.free.entry", "ptr: %p", ptr);

	je_free_impl(ptr);

	LOG("core.free.exit", "");
}